

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall S2BooleanOperation::Impl::Build(Impl *this,S2Error *error)

{
  bool bVar1;
  OpType OVar2;
  SnapFunction *snap_function;
  pointer pSVar3;
  byte local_10e;
  anon_class_8_1_8991fb9c local_100;
  IsFullPolygonPredicate local_f8;
  InputEdgeCrossings *local_d8;
  vector<signed_char,_std::allocator<signed_char>_> *local_d0;
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  *local_c8;
  unique_ptr<(anonymous_namespace)::EdgeClippingLayer,_std::default_delete<(anonymous_namespace)::EdgeClippingLayer>_>
  local_c0;
  unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_> local_b8;
  unique_ptr<S2Builder,_std::default_delete<S2Builder>_> local_b0;
  undefined1 local_a8 [8];
  Options options;
  undefined1 local_88 [8];
  Graph g;
  S2Error *error_local;
  Impl *this_local;
  
  g.is_full_polygon_predicate_._M_invoker = (_Invoker_type)error;
  S2Error::Clear(error);
  bVar1 = is_boolean_output(this);
  if (bVar1) {
    S2Builder::Graph::Graph((Graph *)local_88);
    OVar2 = op_type(this->op_);
    bVar1 = BuildOpType(this,OVar2);
    local_10e = 0;
    if (bVar1) {
      bVar1 = IsFullPolygonResult(this,(Graph *)local_88,
                                  (S2Error *)g.is_full_polygon_predicate_._M_invoker);
      local_10e = bVar1 ^ 0xff;
    }
    *this->op_->result_empty_ = (bool)(local_10e & 1);
    this_local._7_1_ = true;
    S2Builder::Graph::~Graph((Graph *)local_88);
  }
  else {
    snap_function = S2BooleanOperation::Options::snap_function(&this->op_->options_);
    S2Builder::Options::Options((Options *)local_a8,snap_function);
    S2Builder::Options::set_split_crossing_edges((Options *)local_a8,true);
    S2Builder::Options::set_idempotent((Options *)local_a8,false);
    absl::make_unique<S2Builder,S2Builder::Options&>((absl *)&local_b0,(Options *)local_a8);
    std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::operator=
              (&this->builder_,&local_b0);
    std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::~unique_ptr(&local_b0);
    pSVar3 = std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::operator->
                       (&this->builder_);
    local_c8 = &this->op_->layers_;
    local_d0 = &this->input_dimensions_;
    local_d8 = &this->input_crossings_;
    absl::
    make_unique<(anonymous_namespace)::EdgeClippingLayer,std::vector<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>,std::allocator<std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>>>*,std::vector<signed_char,std::allocator<signed_char>>*,std::vector<std::pair<int,(anonymous_namespace)::CrossingInputEdge>,std::allocator<std::pair<int,(anonymous_namespace)::CrossingInputEdge>>>*>
              ((absl *)&local_c0,&local_c8,&local_d0,&local_d8);
    std::unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>>::
    unique_ptr<(anonymous_namespace)::EdgeClippingLayer,std::default_delete<(anonymous_namespace)::EdgeClippingLayer>,void>
              ((unique_ptr<S2Builder::Layer,std::default_delete<S2Builder::Layer>> *)&local_b8,
               &local_c0);
    S2Builder::StartLayer(pSVar3,&local_b8);
    std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>::~unique_ptr
              (&local_b8);
    std::
    unique_ptr<(anonymous_namespace)::EdgeClippingLayer,_std::default_delete<(anonymous_namespace)::EdgeClippingLayer>_>
    ::~unique_ptr(&local_c0);
    pSVar3 = std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::operator->
                       (&this->builder_);
    local_100.this = this;
    std::function<bool(S2Builder::Graph_const&,S2Error*)>::
    function<S2BooleanOperation::Impl::Build(S2Error*)::__0,void>
              ((function<bool(S2Builder::Graph_const&,S2Error*)> *)&local_f8,&local_100);
    S2Builder::AddIsFullPolygonPredicate(pSVar3,&local_f8);
    std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>::~function(&local_f8);
    OVar2 = op_type(this->op_);
    BuildOpType(this,OVar2);
    pSVar3 = std::unique_ptr<S2Builder,_std::default_delete<S2Builder>_>::operator->
                       (&this->builder_);
    this_local._7_1_ = S2Builder::Build(pSVar3,(S2Error *)g.is_full_polygon_predicate_._M_invoker);
    S2Builder::Options::~Options((Options *)local_a8);
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::Build(S2Error* error) {
  error->Clear();
  if (is_boolean_output()) {
    // BuildOpType() returns true if and only if the result has no edges.
    S2Builder::Graph g;  // Unused by IsFullPolygonResult() implementation.
    *op_->result_empty_ =
        BuildOpType(op_->op_type()) && !IsFullPolygonResult(g, error);
    return true;
  }
  // TODO(ericv): Rather than having S2Builder split the edges, it would be
  // faster to call AddVertex() in this class and have a new S2Builder
  // option that increases the edge_snap_radius_ to account for errors in
  // the intersection point (the way that split_crossing_edges does).
  S2Builder::Options options(op_->options_.snap_function());
  options.set_split_crossing_edges(true);

  // TODO(ericv): Ideally idempotent() should be true, but existing clients
  // expect vertices closer than the full "snap_radius" to be snapped.
  options.set_idempotent(false);
  builder_ = make_unique<S2Builder>(options);
  builder_->StartLayer(make_unique<EdgeClippingLayer>(
      &op_->layers_, &input_dimensions_, &input_crossings_));

  // Add a predicate that decides whether a result with no polygon edges should
  // be interpreted as the empty polygon or the full polygon.
  builder_->AddIsFullPolygonPredicate(
      [this](const S2Builder::Graph& g, S2Error* error) {
        return IsFullPolygonResult(g, error);
      });
  (void) BuildOpType(op_->op_type());
  return builder_->Build(error);
}